

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::XmlReporter::test_case_skipped(XmlReporter *this,TestCaseData *in)

{
  allocator<char> local_39;
  string local_38;
  TestCaseData *local_18;
  TestCaseData *in_local;
  XmlReporter *this_local;
  
  if ((this->opt->no_skipped_summary & 1U) == 0) {
    local_18 = in;
    in_local = (TestCaseData *)this;
    test_case_start_impl(this,in);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"skipped",&local_39);
    XmlWriter::writeAttribute(&this->xml,&local_38,"true");
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    XmlWriter::endElement(&this->xml);
  }
  return;
}

Assistant:

void test_case_skipped(const TestCaseData& in) override {
            if(opt.no_skipped_summary == false) {
                test_case_start_impl(in);
                xml.writeAttribute("skipped", "true");
                xml.endElement();
            }
        }